

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O2

from_chars_result_t<char>
fast_float::from_chars<long,char,int>(char *first,char *last,long *value,int base)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  from_chars_result_t<char> fVar10;
  
  uVar4 = 0x16;
  pbVar7 = (byte *)first;
  if (base - 0x25U < 0xffffffdd || first == last) goto LAB_0011b6b8;
  cVar1 = *first;
  for (pbVar7 = (byte *)(first + (cVar1 == '-'));
      (pbVar8 = (byte *)last, pbVar7 != (byte *)last && (pbVar8 = pbVar7, *pbVar7 == 0x30));
      pbVar7 = pbVar7 + 1) {
  }
  pbVar9 = pbVar8;
  if (base == 10) {
    lVar5 = (long)last - (long)pbVar8;
    uVar3 = 0;
    while ((7 < lVar5 &&
           (uVar2 = *(long *)pbVar9 + 0xcfcfcfcfcfcfcfd0,
           ((*(long *)pbVar9 + 0x4646464646464646U | uVar2) & 0x8080808080808080) == 0))) {
      uVar2 = (uVar2 >> 8) + uVar2 * 10;
      uVar3 = ((uVar2 >> 0x10 & 0xff000000ff) * 0x271000000001 +
               (uVar2 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar3 * 100000000;
      pbVar9 = pbVar9 + 8;
      lVar5 = lVar5 + -8;
    }
  }
  else {
    lVar5 = (long)last - (long)pbVar8;
    uVar3 = 0;
  }
  uVar4 = 0x16;
  pbVar6 = pbVar9 + lVar5;
  while ((pbVar7 = pbVar6, pbVar9 != (byte *)last &&
         (pbVar7 = pbVar9, (int)(uint)int_luts<void>::chdigit[*pbVar9] < base))) {
    uVar3 = uVar3 * (uint)base + (ulong)int_luts<void>::chdigit[*pbVar9];
    pbVar9 = pbVar9 + 1;
  }
  if (pbVar7 == pbVar8) {
    pbVar7 = (byte *)first;
    if (pbVar8 <= first + (cVar1 == '-')) goto LAB_0011b6b8;
    uVar2 = 0;
    pbVar7 = pbVar8;
  }
  else {
    uVar4 = 0x22;
    if (*(ulong *)(int_luts<void>::chdigit + (long)base * 8 + 0xf0) <
        (ulong)((long)pbVar7 - (long)pbVar8)) goto LAB_0011b6b8;
    if ((long)pbVar7 - (long)pbVar8 == *(ulong *)(int_luts<void>::chdigit + (long)base * 8 + 0xf0))
    {
      uVar2 = 0x8000000000000000;
      if (cVar1 != '-') {
        uVar2 = 0x7fffffffffffffff;
      }
      if (uVar3 < int_luts<void>::min_safe_u64[(long)base + -2]) goto LAB_0011b6b8;
    }
    else {
      uVar2 = 0x8000000000000000;
      if (cVar1 != '-') {
        uVar2 = 0x7fffffffffffffff;
      }
    }
    if (uVar2 < uVar3) goto LAB_0011b6b8;
    uVar2 = -uVar3;
    if (cVar1 != '-') {
      uVar2 = uVar3;
    }
  }
  *value = uVar2;
  uVar4 = 0;
LAB_0011b6b8:
  fVar10._8_8_ = uVar4;
  fVar10.ptr = (char *)pbVar7;
  return fVar10;
}

Assistant:

FASTFLOAT_CONSTEXPR20
from_chars_result_t<UC> from_chars(UC const* first, UC const* last, T& value, int base) noexcept {
  static_assert (is_supported_char_type<UC>(), "only char, wchar_t, char16_t and char32_t are supported");

  from_chars_result_t<UC> answer;
#ifdef FASTFLOAT_SKIP_WHITE_SPACE  // disabled by default
  while ((first != last) && fast_float::is_space(uint8_t(*first))) {
    first++;
  }
#endif
  if (first == last || base < 2 || base > 36) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  return parse_int_string(first, last, value, base);
}